

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

Belief * __thiscall despot::Tag::ExactPrior(Tag *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TagBelief *this_00;
  int opp;
  int rob;
  int iVar5;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  State *local_70;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_68;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = 0;
  while( true ) {
    iVar1 = despot::Floor::NumCells();
    if (iVar1 <= iVar5) break;
    iVar1 = 0;
    while( true ) {
      iVar2 = despot::Floor::NumCells();
      if (iVar2 <= iVar1) break;
      iVar2 = despot::Floor::NumCells();
      iVar3 = despot::Floor::NumCells();
      iVar4 = despot::Floor::NumCells();
      local_70 = BaseTag::Allocate(&this->super_BaseTag,iVar2 * iVar5 + iVar1,
                                   (1.0 / (double)iVar3) / (double)iVar4);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)&local_68,&local_70);
      iVar1 = iVar1 + 1;
    }
    iVar5 = iVar5 + 1;
  }
  this_00 = (TagBelief *)operator_new(0x98);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_48,
             (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_68);
  TagBelief::TagBelief
            (this_00,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_48,
             &this->super_BaseTag,(Belief *)0x0);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_48);
  despot::ParticleBelief::state_indexer((StateIndexer *)this_00);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_68);
  return (Belief *)this_00;
}

Assistant:

Belief* Tag::ExactPrior() const {
	vector<State*> particles;
	for (int rob = 0; rob < floor_.NumCells(); rob++) {
		for (int opp = 0; opp < floor_.NumCells(); opp++) {
			TagState* state = static_cast<TagState*>(BaseTag::Allocate(
				RobOppIndicesToStateIndex(rob, opp),
				1.0 / floor_.NumCells() / floor_.NumCells()));
			particles.push_back(state);
		}
	}

	TagBelief* belief = new TagBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}